

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_non_uniform.cpp
# Opt level: O1

spv_result_t
spvtools::val::anon_unknown_1::ValidateGroupNonUniformBroadcastFirst
          (ValidationState_t *_,Instruction *inst)

{
  uint32_t id;
  bool bVar1;
  uint32_t uVar2;
  long lVar3;
  char *pcVar4;
  DiagnosticStream local_200;
  
  id = (inst->inst_).type_id;
  bVar1 = ValidationState_t::IsFloatScalarOrVectorType(_,id);
  if (((bVar1) || (bVar1 = ValidationState_t::IsIntScalarOrVectorType(_,id), bVar1)) ||
     (bVar1 = ValidationState_t::IsBoolScalarOrVectorType(_,id), bVar1)) {
    uVar2 = ValidationState_t::GetOperandTypeId(_,inst,3);
    if (uVar2 == id) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar4 = "The type of Value must match the Result type";
    lVar3 = 0x2c;
  }
  else {
    ValidationState_t::diag(&local_200,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar4 = "Result must be a scalar or vector of integer, floating-point, or boolean type";
    lVar3 = 0x4d;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_200,pcVar4,lVar3);
  DiagnosticStream::~DiagnosticStream(&local_200);
  return local_200.error_;
}

Assistant:

spv_result_t ValidateGroupNonUniformBroadcastFirst(ValidationState_t& _,
                                                   const Instruction* inst) {
  const auto type_id = inst->type_id();
  if (!_.IsFloatScalarOrVectorType(type_id) &&
      !_.IsIntScalarOrVectorType(type_id) &&
      !_.IsBoolScalarOrVectorType(type_id)) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Result must be a scalar or vector of integer, floating-point, "
              "or boolean type";
  }

  const auto value_type_id = _.GetOperandTypeId(inst, 3);
  if (value_type_id != type_id) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "The type of Value must match the Result type";
  }

  return SPV_SUCCESS;
}